

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BranchAndBound.cpp
# Opt level: O3

bool __thiscall
tsbp::TwoStepBranchingProcedure::IsPlacementFeasible
          (TwoStepBranchingProcedure *this,PackingRelaxed2D *packing,Rectangle *itemToPlace)

{
  int iVar1;
  uint uVar2;
  bool bVar3;
  int iVar4;
  pointer pRVar5;
  ulong uVar6;
  long lVar7;
  int local_48;
  int local_44;
  ulong local_40;
  
  uVar6 = packing->MinX;
  if ((long)itemToPlace->Dx + uVar6 <= (ulong)(long)(this->container).super_Rectangle.Dx) {
    local_48 = (this->container).super_Rectangle.Dy;
    local_40 = (ulong)local_48;
    if ((long)itemToPlace->Dy +
        (packing->PlacedAreaVector).
        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start[uVar6] <= local_40) {
      if ((*(ulong *)(*(long *)&(this->itemSpecificPlacementPointsX).
                                super__Vector_base<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start[itemToPlace->InternId].
                                m_bits.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl + (uVar6 >> 6) * 8) >> (uVar6 & 0x3f) & 1) == 0) {
        return false;
      }
      pRVar5 = (this->items).super__Vector_base<tsbp::Rectangle,_std::allocator<tsbp::Rectangle>_>.
               _M_impl.super__Vector_impl_data._M_start;
      if ((this->items).super__Vector_base<tsbp::Rectangle,_std::allocator<tsbp::Rectangle>_>.
          _M_impl.super__Vector_impl_data._M_finish == pRVar5) {
        local_44 = 0;
        local_40._0_4_ = local_48;
      }
      else {
        uVar6 = 0;
        lVar7 = 0x10;
        local_44 = 0;
        do {
          bVar3 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::test
                            (&packing->PlacedItems,(long)*(int *)((long)&pRVar5->X + lVar7));
          iVar4 = *(int *)((long)&pRVar5->X + lVar7);
          if (bVar3) {
            if ((packing->MinX ==
                 (long)(packing->ItemCoordinatesX).super__Vector_base<int,_std::allocator<int>_>.
                       _M_impl.super__Vector_impl_data._M_start[iVar4]) &&
               (itemToPlace->InternId < iVar4)) {
              return false;
            }
          }
          else {
            if (iVar4 != itemToPlace->InternId) {
              iVar1 = *(int *)((long)pRVar5 + lVar7 + -4);
              if (iVar1 < local_48) {
                local_48 = iVar1;
              }
              iVar1 = *(int *)((long)pRVar5 + lVar7 + -8);
              if (local_44 <= iVar1) {
                local_44 = iVar1;
              }
            }
            if (itemToPlace->InternId < iVar4) {
              uVar2 = *(uint *)((long)pRVar5 + lVar7 + -4);
              iVar4 = (int)local_40;
              local_40 = local_40 & 0xffffffff;
              if ((int)uVar2 < iVar4) {
                local_40 = (ulong)uVar2;
              }
            }
          }
          uVar6 = uVar6 + 1;
          pRVar5 = (this->items).
                   super__Vector_base<tsbp::Rectangle,_std::allocator<tsbp::Rectangle>_>._M_impl.
                   super__Vector_impl_data._M_start;
          lVar7 = lVar7 + 0x20;
        } while (uVar6 < (ulong)((long)(this->items).
                                       super__Vector_base<tsbp::Rectangle,_std::allocator<tsbp::Rectangle>_>
                                       ._M_impl.super__Vector_impl_data._M_finish - (long)pRVar5 >>
                                5));
      }
      packing->MinimumRemainingItemDy = local_48;
      packing->MinimumRemainingItemDyAtCurrentX = (int)local_40;
      packing->MaximumRemainingItemDx = local_44;
      return true;
    }
  }
  return false;
}

Assistant:

bool TwoStepBranchingProcedure::IsPlacementFeasible(PackingRelaxed2D& packing, const Rectangle& itemToPlace)
{
    // No need to check feasibility in y-direction for x > packing.MinX, because, by construction, packing.PlacedAreaVector (K(x)) is non-increasing.
    if (packing.MinX + itemToPlace.Dx > this->container.Dx || packing.PlacedAreaVector[packing.MinX] + itemToPlace.Dy > this->container.Dy)
    {
        return false;
    }

    if (!this->itemSpecificPlacementPointsX[itemToPlace.InternId][packing.MinX])
    {
        return false;
    }

    int maximumRemainingItemDx = 0;
    int minimumRemainingItemDy = this->container.Dy;
    int minimumRemainingItemDyAtCurrentX = this->container.Dy;
    for (size_t i = 0; i < items.size(); i++)
    {
        const Rectangle& item = items[i];
        // Caution, requires i == items[i].InternId
        if (packing.PlacedItems.test(item.InternId))
        {
            if (packing.ItemCoordinatesX[item.InternId] == packing.MinX
                && itemToPlace.InternId < item.InternId)
            {
                return false;
            }
        }
        else
        {
            if (item.InternId != itemToPlace.InternId)
            {
                minimumRemainingItemDy = std::min<int>(minimumRemainingItemDy, item.Dy);
                maximumRemainingItemDx = std::max<int>(maximumRemainingItemDx, item.Dx);
            }

            if (itemToPlace.InternId < item.InternId)
            {
                minimumRemainingItemDyAtCurrentX = std::min<int>(minimumRemainingItemDyAtCurrentX, item.Dy);
            }
        }
    }

    ////packing.MinimumRemainingItemDy = 0;
    ////packing.MinimumRemainingItemDyAtCurrentX = 0;
    packing.MinimumRemainingItemDy = minimumRemainingItemDy;
    packing.MinimumRemainingItemDyAtCurrentX = minimumRemainingItemDyAtCurrentX;
    packing.MaximumRemainingItemDx = maximumRemainingItemDx;

    return true;
}